

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * cfd::core::HashUtil::Sha512(ByteData *__return_storage_ptr__,ByteData256 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ByteData256 *local_18;
  ByteData256 *data_local;
  
  local_18 = data;
  data_local = (ByteData256 *)__return_storage_ptr__;
  ByteData256::GetBytes(&local_30,data);
  Sha512(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Sha512(const ByteData256 &data) {
  return Sha512(data.GetBytes());
}